

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeString::indexOf
          (UnicodeString *this,char16_t *srcChars,int32_t srcLength,int32_t start)

{
  short sVar1;
  int32_t iVar2;
  int local_24;
  
  local_24 = start;
  pinIndex(this,&local_24);
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  iVar2 = indexOf(this,srcChars,0,srcLength,local_24,iVar2 - local_24);
  return iVar2;
}

Assistant:

inline int32_t
UnicodeString::indexOf(const char16_t *srcChars,
               int32_t srcLength,
               int32_t start) const {
  pinIndex(start);
  return indexOf(srcChars, 0, srcLength, start, length() - start);
}